

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::rebuildOrderHeap(Solver *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_RDI;
  vec<int> *in_stack_00000018;
  Var v;
  uint in_stack_ffffffffffffffd8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 dealloc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  lbool local_e;
  lbool local_d;
  int local_c;
  
  dealloc = (undefined1)((uint)in_stack_ffffffffffffffdc >> 0x18);
  iVar2 = decisionLevel((Solver *)0x1362a8);
  if (iVar2 == 0) {
    in_stack_ffffffffffffffe0 =
         Heap<Minisat::Solver::VarOrderLt>::size((Heap<Minisat::Solver::VarOrderLt> *)0x1362be);
    in_stack_ffffffffffffffe4 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
    in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe0 + in_stack_ffffffffffffffe4;
    iVar2 = nVars((Solver *)0x1362e9);
    if (iVar2 <= in_stack_ffffffffffffffe4) {
      return;
    }
  }
  vec<int>::clear((vec<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (bool)dealloc);
  local_c = 0;
  while (iVar2 = local_c, iVar3 = nVars((Solver *)0x136325), iVar2 < iVar3) {
    pcVar4 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x340),local_c);
    uVar5 = in_stack_ffffffffffffffd8 & 0xffffff;
    if (*pcVar4 != '\0') {
      local_d = value((Solver *)(CONCAT44(iVar2,in_stack_ffffffffffffffd8) & 0xffffffff00ffffff),0);
      lbool::lbool(&local_e,'\x02');
      bVar1 = lbool::operator==(&local_d,local_e);
      uVar5 = CONCAT13(bVar1,(int3)uVar5);
    }
    in_stack_ffffffffffffffd8 = uVar5;
    if ((char)(in_stack_ffffffffffffffd8 >> 0x18) != '\0') {
      vec<int>::push((vec<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    }
    local_c = local_c + 1;
  }
  Heap<Minisat::Solver::VarOrderLt>::build
            ((Heap<Minisat::Solver::VarOrderLt> *)this,in_stack_00000018);
  iVar2 = Heap<Minisat::Solver::VarOrderLt>::size((Heap<Minisat::Solver::VarOrderLt> *)0x1363e5);
  *(int *)(in_RDI + 0x480) = iVar2;
  return;
}

Assistant:

void Solver::rebuildOrderHeap()
{
    /* all unassigned variables present, no need to rebuild */
    if (decisionLevel() == 0 && (order_heap->size() + trail.size() >= nVars())) {
        TRACE(for (Var v = 0; v < nVars(); v++) {
            assert((!decision[v] || value(v) != l_Undef || order_heap->inHeap(v)) &&
                   "unassigned variables have to be present in the heap");
        });
        return;
    }

    decision_rebuild_vars.clear();
    for (Var v = 0; v < nVars(); v++)
        if (decision[v] && value(v) == l_Undef) decision_rebuild_vars.push(v);

    order_heap->build(decision_rebuild_vars);
    full_heap_size = order_heap->size();
}